

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O0

bool SetGenericProperty<aiMatrix4x4t<float>>
               (map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
                *list,char *szName,aiMatrix4x4t<float> *value)

{
  bool bVar1;
  reference ppVar2;
  pair<unsigned_int,_aiMatrix4x4t<float>_> local_84;
  _Self local_40;
  _Self local_38;
  iterator it;
  uint32_t hash;
  aiMatrix4x4t<float> *value_local;
  char *szName_local;
  map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
  *list_local;
  
  if (szName != (char *)0x0) {
    it._M_node._4_4_ = SuperFastHash(szName,0,0);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
         ::find(list,(key_type *)((long)&it._M_node + 4));
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
         ::end(list);
    bVar1 = std::operator==(&local_38,&local_40);
    if (bVar1) {
      std::pair<unsigned_int,_aiMatrix4x4t<float>_>::pair<unsigned_int,_aiMatrix4x4t<float>,_true>
                (&local_84,(uint *)((long)&it._M_node + 4),value);
      std::
      map<unsigned_int,aiMatrix4x4t<float>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>>
      ::insert<std::pair<unsigned_int,aiMatrix4x4t<float>>>
                ((map<unsigned_int,aiMatrix4x4t<float>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>>
                  *)list,&local_84);
    }
    else {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>::
               operator*(&local_38);
      memcpy(&ppVar2->second,value,0x40);
    }
    list_local._7_1_ = !bVar1;
    return list_local._7_1_;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/GenericProperty.h"
                ,0x39,
                "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = aiMatrix4x4t<float>]"
               );
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}